

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ExprCodeGetColumnOfTable(Vdbe *v,Table *pTab,int iTabCur,int iCol,int regOut)

{
  byte *pbVar1;
  ushort uVar2;
  Parse *pParse;
  short sVar3;
  Index *pIdx;
  int p2;
  int iVar4;
  Column *pCol;
  
  if ((-1 < iCol) && (pTab->iPKey != iCol)) {
    iVar4 = 0xb0;
    p2 = iCol;
    if (pTab->eTabType != '\x01') {
      uVar2 = pTab->aCol[(uint)iCol].colFlags;
      if ((uVar2 & 0x20) != 0) {
        pCol = pTab->aCol + (uint)iCol;
        pParse = v->pParse;
        if ((uVar2 >> 8 & 1) == 0) {
          iVar4 = pParse->iSelfTab;
          pCol->colFlags = uVar2 | 0x100;
          pParse->iSelfTab = iTabCur + 1;
          sqlite3ExprCodeGeneratedColumn(pParse,pTab,pCol,regOut);
          pParse->iSelfTab = iVar4;
          pbVar1 = (byte *)((long)&pCol->colFlags + 1);
          *pbVar1 = *pbVar1 & 0xfe;
          return;
        }
        sqlite3ErrorMsg(pParse,"generated column loop on \"%s\"",pCol->zCnName);
        return;
      }
      if ((pTab->tabFlags & 0x80) == 0) {
        sVar3 = sqlite3TableColumnToStorage(pTab,(i16)iCol);
      }
      else {
        pIdx = sqlite3PrimaryKeyIndex(pTab);
        sVar3 = sqlite3TableColumnToIndex(pIdx,(i16)iCol);
      }
      p2 = (int)sVar3;
      iVar4 = 0x5e;
    }
    sqlite3VdbeAddOp3(v,iVar4,iTabCur,p2,regOut);
    sqlite3ColumnDefault(v,pTab,iCol,regOut);
    return;
  }
  sqlite3VdbeAddOp2(v,0x87,iTabCur,regOut);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCodeGetColumnOfTable(
  Vdbe *v,        /* Parsing context */
  Table *pTab,    /* The table containing the value */
  int iTabCur,    /* The table cursor.  Or the PK cursor for WITHOUT ROWID */
  int iCol,       /* Index of the column to extract */
  int regOut      /* Extract the value into this register */
){
  Column *pCol;
  assert( v!=0 );
  assert( pTab!=0 );
  assert( iCol!=XN_EXPR );
  if( iCol<0 || iCol==pTab->iPKey ){
    sqlite3VdbeAddOp2(v, OP_Rowid, iTabCur, regOut);
    VdbeComment((v, "%s.rowid", pTab->zName));
  }else{
    int op;
    int x;
    if( IsVirtual(pTab) ){
      op = OP_VColumn;
      x = iCol;
#ifndef SQLITE_OMIT_GENERATED_COLUMNS
    }else if( (pCol = &pTab->aCol[iCol])->colFlags & COLFLAG_VIRTUAL ){
      Parse *pParse = sqlite3VdbeParser(v);
      if( pCol->colFlags & COLFLAG_BUSY ){
        sqlite3ErrorMsg(pParse, "generated column loop on \"%s\"",
                        pCol->zCnName);
      }else{
        int savedSelfTab = pParse->iSelfTab;
        pCol->colFlags |= COLFLAG_BUSY;
        pParse->iSelfTab = iTabCur+1;
        sqlite3ExprCodeGeneratedColumn(pParse, pTab, pCol, regOut);
        pParse->iSelfTab = savedSelfTab;
        pCol->colFlags &= ~COLFLAG_BUSY;
      }
      return;
#endif
    }else if( !HasRowid(pTab) ){
      testcase( iCol!=sqlite3TableColumnToStorage(pTab, iCol) );
      x = sqlite3TableColumnToIndex(sqlite3PrimaryKeyIndex(pTab), iCol);
      op = OP_Column;
    }else{
      x = sqlite3TableColumnToStorage(pTab,iCol);
      testcase( x!=iCol );
      op = OP_Column;
    }
    sqlite3VdbeAddOp3(v, op, iTabCur, x, regOut);
    sqlite3ColumnDefault(v, pTab, iCol, regOut);
  }
}